

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

double benchmark::ChildrenCPUUsage(void)

{
  int iVar1;
  undefined1 local_a0 [8];
  rusage ru;
  
  iVar1 = getrusage(RUSAGE_CHILDREN,(rusage *)local_a0);
  if (iVar1 == 0) {
    ru.field_15 = (anon_union_8_2_1ea8062a_for_rusage_28)
                  ((double)ru.ru_stime.tv_sec * 1e-06 +
                  (double)ru.ru_utime.tv_sec * 1e-06 + (double)(long)local_a0 +
                  (double)ru.ru_utime.tv_usec);
  }
  else {
    ru.field_15.ru_nivcsw = 0;
  }
  return (double)ru.field_15.ru_nivcsw;
}

Assistant:

double ChildrenCPUUsage() {
#ifndef BENCHMARK_OS_WINDOWS
  struct rusage ru;
  if (getrusage(RUSAGE_CHILDREN, &ru) == 0) {
    return (static_cast<double>(ru.ru_utime.tv_sec) +
            static_cast<double>(ru.ru_utime.tv_usec) * 1e-6 +
            static_cast<double>(ru.ru_stime.tv_sec) +
            static_cast<double>(ru.ru_stime.tv_usec) * 1e-6);
  } else {
    return 0.0;
  }
#else
  // TODO: Not sure what this even means on Windows
  return 0.0;
#endif  // OS_WINDOWS
}